

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPRequest.cpp
# Opt level: O3

void __thiscall HTTPRequest::HTTPRequest(HTTPRequest *this,char *request,int requestSize)

{
  string *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  long *plVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  int iVar4;
  long lVar5;
  istream *piVar6;
  mapped_type *pmVar7;
  iterator iVar8;
  int *piVar9;
  undefined8 uVar10;
  uint uVar11;
  ulong uVar12;
  char *pcVar14;
  string reqStr;
  string header;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  string firstLine;
  stringstream ss;
  stringstream firstLineSS;
  undefined1 *local_428;
  long local_420;
  undefined1 local_418;
  undefined7 uStack_417;
  string *local_408;
  string *local_400;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_3f8;
  key_type local_3f0;
  key_type local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_398;
  _Base_ptr local_390;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_388;
  long *local_368 [2];
  long local_358 [2];
  char *local_348;
  undefined1 local_340 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330 [7];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  ulong uVar13;
  
  local_398 = &(this->method).field_2;
  (this->method)._M_dataplus._M_p = (pointer)local_398;
  (this->method)._M_string_length = 0;
  (this->method).field_2._M_local_buf[0] = '\0';
  this_00 = &this->filepath;
  local_3a0 = &(this->filepath).field_2;
  (this->filepath)._M_dataplus._M_p = (pointer)local_3a0;
  (this->filepath)._M_string_length = 0;
  (this->filepath).field_2._M_local_buf[0] = '\0';
  local_408 = (string *)&this->query;
  local_3a8 = &(this->query).field_2;
  (this->query)._M_dataplus._M_p = (pointer)local_3a8;
  (this->query)._M_string_length = 0;
  (this->query).field_2._M_local_buf[0] = '\0';
  local_3f8 = &this->headers;
  local_390 = &(this->headers)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_390;
  (this->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_390;
  (this->headers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_400 = (string *)&this->body;
  local_3b0 = &(this->body).field_2;
  (this->body)._M_dataplus._M_p = (pointer)local_3b0;
  (this->body)._M_string_length = 0;
  (this->body).field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream(local_1b8);
  uVar13 = 0;
  if (0 < requestSize) {
    uVar12 = 0;
    do {
      cVar2 = request[uVar12];
      uVar13 = uVar12;
      if ((cVar2 == '\0') || (cVar2 == '\n')) break;
      local_340[0] = cVar2;
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_340,1);
      uVar12 = uVar12 + 1;
      uVar13 = (ulong)(uint)requestSize;
    } while ((uint)requestSize != uVar12);
  }
  std::__cxx11::stringbuf::str();
  lVar5 = std::__cxx11::string::find((char *)local_368,0x10833c,0);
  if (lVar5 == -1) {
    this->valid = false;
  }
  else {
    local_388.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_388.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_388.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_340._0_8_ = local_340 + 0x10;
    local_340._8_8_ = 0;
    local_330[0]._M_local_buf[0] = '\0';
    while (piVar6 = std::operator>>((istream *)local_1b8,(string *)local_340),
          ((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_388,(value_type *)local_340);
    }
    if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
      operator_delete((void *)local_340._0_8_,
                      CONCAT71(local_330[0]._M_allocated_capacity._1_7_,local_330[0]._M_local_buf[0]
                              ) + 1);
    }
    std::__cxx11::string::_M_assign((string *)this);
    std::__cxx11::string::_M_assign((string *)this_00);
    lVar5 = std::__cxx11::string::find((char *)this_00,0x108345,0);
    if (lVar5 == -1) {
      std::__cxx11::string::_M_replace
                ((ulong)local_408,0,(char *)(this->query)._M_string_length,0x108392);
    }
    else {
      std::__cxx11::string::substr((ulong)local_340,(ulong)this_00);
      std::__cxx11::string::operator=(local_408,(string *)local_340);
      if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
        operator_delete((void *)local_340._0_8_,
                        CONCAT71(local_330[0]._M_allocated_capacity._1_7_,
                                 local_330[0]._M_local_buf[0]) + 1);
      }
      std::__cxx11::string::substr((ulong)local_340,(ulong)this_00);
      std::__cxx11::string::operator=((string *)this_00,(string *)local_340);
      if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
        operator_delete((void *)local_340._0_8_,
                        CONCAT71(local_330[0]._M_allocated_capacity._1_7_,
                                 local_330[0]._M_local_buf[0]) + 1);
      }
    }
    std::__cxx11::string::substr((ulong)local_340,(ulong)this_00);
    std::__cxx11::string::operator=((string *)this_00,(string *)local_340);
    if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
      operator_delete((void *)local_340._0_8_,
                      CONCAT71(local_330[0]._M_allocated_capacity._1_7_,local_330[0]._M_local_buf[0]
                              ) + 1);
    }
    iVar4 = std::__cxx11::string::compare((char *)this_00);
    if (iVar4 == 0) {
      std::__cxx11::string::_M_assign((string *)this_00);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_340);
    if ((int)uVar13 < requestSize) {
      pcVar14 = request + (uVar13 & 0xffffffff);
      do {
        local_428 = (undefined1 *)CONCAT71(local_428._1_7_,*pcVar14);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_340 + 0x10),(char *)&local_428,1);
        pcVar14 = pcVar14 + 1;
        uVar11 = (int)uVar13 + 1;
        uVar13 = (ulong)uVar11;
      } while ((int)uVar11 < requestSize);
    }
    this_01 = local_3f8;
    local_420 = 0;
    local_418 = 0;
    paVar1 = &local_3f0.field_2;
    local_428 = &local_418;
    while (piVar6 = std::operator>>((istream *)local_340,(string *)&local_428),
          ((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) {
      if (local_428[local_420 + -1] == ':') {
        std::__cxx11::string::substr((ulong)&local_3f0,(ulong)&local_428);
        std::operator>>((istream *)local_340,(string *)&local_428);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](this_01,&local_3f0);
        std::__cxx11::string::_M_assign((string *)pmVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f0._M_dataplus._M_p != paVar1) {
          operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if (local_428 != &local_418) {
      operator_delete(local_428,CONCAT71(uStack_417,local_418) + 1);
    }
    std::__cxx11::string::_M_replace
              ((ulong)local_400,0,(char *)(this->body)._M_string_length,0x108392);
    std::__cxx11::stringbuf::str();
    local_3f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"Content-Length","");
    iVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_01->_M_t,&local_3f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
    }
    if (iVar8._M_node != local_390) {
      local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"Content-Length","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_3f8,&local_3d0);
      pcVar14 = (pmVar7->_M_dataplus)._M_p;
      piVar9 = __errno_location();
      iVar4 = *piVar9;
      *piVar9 = 0;
      lVar5 = strtol(pcVar14,&local_348,10);
      if (local_348 == pcVar14) {
        std::__throw_invalid_argument("stoi");
LAB_00106457:
        uVar10 = std::__throw_out_of_range("stoi");
        if (local_428 != &local_418) {
          operator_delete(local_428,CONCAT71(uStack_417,local_418) + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
        std::ios_base::~ios_base(local_2c0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_388);
        if (local_368[0] != local_358) {
          operator_delete(local_368[0],local_358[0] + 1);
        }
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*(long **)local_400 != local_3b0) {
          operator_delete(*(long **)local_400,local_3b0->_M_allocated_capacity + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_3f8->_M_t);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*(long **)local_408 != local_3a8) {
          operator_delete(*(long **)local_408,local_3a8->_M_allocated_capacity + 1);
        }
        plVar3 = (long *)(this_00->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar3 != local_3a0) {
          operator_delete(plVar3,local_3a0->_M_allocated_capacity + 1);
        }
        plVar3 = (long *)(this->method)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar3 != local_398) {
          operator_delete(plVar3,local_398->_M_allocated_capacity + 1);
        }
        _Unwind_Resume(uVar10);
      }
      if (((int)lVar5 != lVar5) || (*piVar9 == 0x22)) goto LAB_00106457;
      if (*piVar9 == 0) {
        *piVar9 = iVar4;
      }
      std::__cxx11::string::substr((ulong)&local_3f0,(ulong)&local_428);
      std::__cxx11::string::operator=(local_400,(string *)&local_3f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
        operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
      }
    }
    this->valid = true;
    if (local_428 != &local_418) {
      operator_delete(local_428,CONCAT71(uStack_417,local_418) + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_388);
  }
  if (local_368[0] != local_358) {
    operator_delete(local_368[0],local_358[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

HTTPRequest::HTTPRequest(char* request, int requestSize)
{
    std::stringstream firstLineSS;
    int i = 0;
    for (i = 0; i < requestSize; i++)
    {
        if (request[i] == '\n' || request[i] == 0) break;
        firstLineSS << request[i];
    }
    std::string firstLine = firstLineSS.str();
    if (firstLine.find("HTTP/1.1") == std::string::npos)
    {
        valid = false;
        return;
    }
    std::vector<std::string> words;
    for (std::string word; firstLineSS >> word;)
        words.push_back(word);
    
    method = words[0];
    filepath = words[1];

    auto pos = filepath.find("?");
    if (pos != std::string::npos)
    {
        query = filepath.substr(pos + 1);
        filepath = filepath.substr(0, pos);
    }
    else query = "";
    filepath = filepath.substr(1);
    if (filepath == "") filepath = ENTRYPOINT;
    
    std::stringstream ss;
    for (; i < requestSize; i++) ss << request[i];
    for (std::string word; ss >> word;)
    {
        if (word.back() != ':') continue;
        std::string header = word.substr(0, word.size() - 1);
        ss >> word;
        headers[header] = word;
    }
    body = "";
    std::string reqStr = ss.str();
    if (headers.find("Content-Length") != headers.end())
        body = reqStr.substr(reqStr.size() - stoi(headers["Content-Length"]));

    valid = true;
}